

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

void testing::internal::TuplePrefix<2ul>::
     ExplainMatchFailuresTo<std::tuple<testing::Matcher<int>,testing::Matcher<pstore::gsl::span<unsigned_char,_1l>const&>>,std::tuple<int,pstore::gsl::span<unsigned_char,_1l>const&>>
               (tuple<testing::Matcher<int>,_testing::Matcher<const_pstore::gsl::span<unsigned_char,__1L>_&>_>
                *matchers,tuple<int,_const_pstore::gsl::span<unsigned_char,__1L>_&> *values,
               ostream *os)

{
  span<unsigned_char,__1L> *x;
  bool bVar1;
  ostream *poVar2;
  type matcher;
  string local_1d0;
  StringMatchResultListener listener;
  
  TuplePrefix<1ul>::
  ExplainMatchFailuresTo<std::tuple<testing::Matcher<int>,testing::Matcher<pstore::gsl::span<unsigned_char,_1l>const&>>,std::tuple<int,pstore::gsl::span<unsigned_char,_1l>const&>>
            (matchers,values,os);
  Matcher<const_pstore::gsl::span<unsigned_char,_-1L>_&>::Matcher
            (&matcher,(Matcher<const_pstore::gsl::span<unsigned_char,__1L>_&> *)matchers);
  x = (values->super__Tuple_impl<0UL,_int,_const_pstore::gsl::span<unsigned_char,__1L>_&>).
      super__Tuple_impl<1UL,_const_pstore::gsl::span<unsigned_char,__1L>_&>.
      super__Head_base<1UL,_const_pstore::gsl::span<unsigned_char,__1L>_&,_false>._M_head_impl;
  StringMatchResultListener::StringMatchResultListener(&listener);
  bVar1 = MatcherBase<const_pstore::gsl::span<unsigned_char,_-1L>_&>::MatchAndExplain
                    (&matcher.super_MatcherBase<const_pstore::gsl::span<unsigned_char,__1L>_&>,x,
                     &listener.super_MatchResultListener);
  if (!bVar1) {
    poVar2 = std::operator<<(os,"  Expected arg #");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,": ");
    MatcherBase<const_pstore::gsl::span<unsigned_char,_-1L>_&>::DescribeTo
              ((MatcherBase<const_pstore::gsl::span<unsigned_char,__1L>_&> *)matchers,os);
    std::operator<<(os,"\n           Actual: ");
    ContainerPrinter::PrintValue<pstore::gsl::span<unsigned_char,_1l>,void>(x,os);
    std::__cxx11::stringbuf::str();
    PrintIfNotEmpty(&local_1d0,os);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::operator<<(os,"\n");
  }
  StringMatchResultListener::~StringMatchResultListener(&listener);
  MatcherBase<const_pstore::gsl::span<unsigned_char,_-1L>_&>::~MatcherBase
            (&matcher.super_MatcherBase<const_pstore::gsl::span<unsigned_char,__1L>_&>);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename std::tuple_element<N - 1, MatcherTuple>::type matcher =
        std::get<N - 1>(matchers);
    typedef typename std::tuple_element<N - 1, ValueTuple>::type Value;
    const Value& value = std::get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      *os << "  Expected arg #" << N - 1 << ": ";
      std::get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }